

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O2

Iterator * __thiscall icu_63::UCharsTrie::Iterator::reset(Iterator *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  this->pos_ = this->initialPos_;
  iVar1 = this->initialRemainingMatchLength_;
  this->remainingMatchLength_ = iVar1;
  this->skipValue_ = '\0';
  uVar2 = this->maxLength_;
  uVar3 = uVar2;
  if (iVar1 < (int)uVar2) {
    uVar3 = iVar1 + 1U;
  }
  if ((int)uVar2 < 1) {
    uVar3 = iVar1 + 1U;
  }
  UnicodeString::truncate(&this->str_,(char *)(ulong)uVar3,(ulong)uVar2);
  this->pos_ = this->pos_ + (int)uVar3;
  this->remainingMatchLength_ = this->remainingMatchLength_ - uVar3;
  UVector32::setSize(this->stack_,0);
  return this;
}

Assistant:

UCharsTrie::Iterator &
UCharsTrie::Iterator::reset() {
    pos_=initialPos_;
    remainingMatchLength_=initialRemainingMatchLength_;
    skipValue_=FALSE;
    int32_t length=remainingMatchLength_+1;  // Remaining match length.
    if(maxLength_>0 && length>maxLength_) {
        length=maxLength_;
    }
    str_.truncate(length);
    pos_+=length;
    remainingMatchLength_-=length;
    stack_->setSize(0);
    return *this;
}